

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_compute_backward(ggml_context *ctx,ggml_tensor *tensor,_Bool inplace)

{
  long lVar1;
  long lVar2;
  ggml_tensor *pgVar3;
  long in_RSI;
  ggml_tensor *in_RDI;
  ggml_tensor *src1;
  ggml_tensor *src0;
  undefined4 in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffecc;
  ggml_context *in_stack_fffffffffffffed0;
  ggml_tensor *in_stack_fffffffffffffed8;
  _Bool inplace_00;
  undefined1 uVar4;
  ggml_tensor *in_stack_fffffffffffffee0;
  ggml_tensor *in_stack_fffffffffffffee8;
  ggml_context *in_stack_fffffffffffffef0;
  ggml_tensor *in_stack_ffffffffffffff00;
  ggml_tensor *in_stack_ffffffffffffff08;
  ggml_context *in_stack_ffffffffffffff10;
  
  lVar1 = *(long *)(in_RSI + 0x48);
  lVar2 = *(long *)(in_RSI + 0x50);
  inplace_00 = SUB81((ulong)in_stack_fffffffffffffed8 >> 0x38,0);
  switch(*(undefined4 *)(in_RSI + 0x38)) {
  case 0:
    break;
  case 1:
    if (*(long *)(lVar1 + 0x40) != 0) {
      pgVar3 = ggml_add_impl(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                             in_stack_fffffffffffffee0,inplace_00);
      *(ggml_tensor **)(lVar1 + 0x40) = pgVar3;
    }
    break;
  case 2:
    if (*(long *)(lVar1 + 0x40) != 0) {
      pgVar3 = ggml_add_impl(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                             in_stack_fffffffffffffee0,inplace_00);
      *(ggml_tensor **)(lVar1 + 0x40) = pgVar3;
    }
    if (*(long *)(lVar2 + 0x40) != 0) {
      pgVar3 = ggml_add_impl(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                             in_stack_fffffffffffffee0,
                             SUB81((ulong)in_stack_fffffffffffffed8 >> 0x38,0));
      *(ggml_tensor **)(lVar2 + 0x40) = pgVar3;
    }
    break;
  case 3:
    if (*(long *)(lVar1 + 0x40) != 0) {
      pgVar3 = ggml_add_impl(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                             in_stack_fffffffffffffee0,inplace_00);
      *(ggml_tensor **)(lVar1 + 0x40) = pgVar3;
    }
    if (*(long *)(lVar2 + 0x40) != 0) {
      pgVar3 = ggml_sub_impl(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                             in_stack_fffffffffffffee0,
                             SUB81((ulong)in_stack_fffffffffffffed8 >> 0x38,0));
      *(ggml_tensor **)(lVar2 + 0x40) = pgVar3;
    }
    break;
  case 4:
    if (*(long *)(lVar1 + 0x40) != 0) {
      ggml_mul(in_stack_fffffffffffffed0,
               (ggml_tensor *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (ggml_tensor *)0x14ea4d);
      pgVar3 = ggml_add_impl(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                             in_stack_fffffffffffffee0,
                             SUB81((ulong)in_stack_fffffffffffffed8 >> 0x38,0));
      *(ggml_tensor **)(lVar1 + 0x40) = pgVar3;
    }
    uVar4 = (undefined1)((ulong)in_stack_fffffffffffffed8 >> 0x38);
    if (*(long *)(lVar2 + 0x40) != 0) {
      ggml_mul(in_stack_fffffffffffffed0,
               (ggml_tensor *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (ggml_tensor *)0x14ead4);
      pgVar3 = ggml_add_impl(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                             in_stack_fffffffffffffee0,(_Bool)uVar4);
      *(ggml_tensor **)(lVar2 + 0x40) = pgVar3;
    }
    break;
  case 5:
    if (*(long *)(lVar1 + 0x40) != 0) {
      ggml_div(in_stack_fffffffffffffed0,
               (ggml_tensor *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (ggml_tensor *)0x14eb60);
      pgVar3 = ggml_add_impl(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                             in_stack_fffffffffffffee0,
                             SUB81((ulong)in_stack_fffffffffffffed8 >> 0x38,0));
      *(ggml_tensor **)(lVar1 + 0x40) = pgVar3;
    }
    uVar4 = (undefined1)((ulong)in_stack_fffffffffffffed8 >> 0x38);
    if (*(long *)(lVar2 + 0x40) != 0) {
      ggml_div(in_stack_fffffffffffffed0,
               (ggml_tensor *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (ggml_tensor *)0x14ec0b);
      ggml_mul(in_stack_fffffffffffffed0,
               (ggml_tensor *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (ggml_tensor *)0x14ec23);
      pgVar3 = ggml_sub_impl(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                             in_stack_fffffffffffffee0,(_Bool)uVar4);
      *(ggml_tensor **)(lVar2 + 0x40) = pgVar3;
    }
    break;
  case 6:
    if (*(long *)(lVar1 + 0x40) != 0) {
      ggml_mul(in_stack_fffffffffffffed0,
               (ggml_tensor *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (ggml_tensor *)0x14ecc3);
      ggml_new_f32(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
      ggml_repeat((ggml_context *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                  in_stack_fffffffffffffed8);
      uVar4 = (undefined1)((ulong)in_stack_fffffffffffffed8 >> 0x38);
      ggml_mul(in_stack_fffffffffffffed0,
               (ggml_tensor *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (ggml_tensor *)0x14ed20);
      pgVar3 = ggml_add_impl(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                             in_stack_fffffffffffffee0,(_Bool)uVar4);
      *(ggml_tensor **)(lVar1 + 0x40) = pgVar3;
    }
    break;
  case 7:
    if (*(long *)(lVar1 + 0x40) != 0) {
      ggml_new_f32(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
      ggml_repeat((ggml_context *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                  in_stack_fffffffffffffed8);
      uVar4 = (undefined1)((ulong)in_stack_fffffffffffffed8 >> 0x38);
      ggml_div(in_stack_fffffffffffffed0,
               (ggml_tensor *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (ggml_tensor *)0x14ede8);
      pgVar3 = ggml_add_impl(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                             in_stack_fffffffffffffee0,(_Bool)uVar4);
      *(ggml_tensor **)(lVar1 + 0x40) = pgVar3;
    }
    break;
  case 8:
    if (*(long *)(lVar1 + 0x40) != 0) {
      ggml_repeat((ggml_context *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                  in_stack_fffffffffffffed8);
      pgVar3 = ggml_add_impl(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                             in_stack_fffffffffffffee0,
                             SUB81((ulong)in_stack_fffffffffffffed8 >> 0x38,0));
      *(ggml_tensor **)(lVar1 + 0x40) = pgVar3;
    }
    break;
  case 9:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x2276,
            "false");
    abort();
  case 10:
    if (*(long *)(lVar1 + 0x40) != 0) {
      ggml_sum((ggml_context *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      pgVar3 = ggml_add_impl(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                             in_stack_fffffffffffffee0,
                             SUB81((ulong)in_stack_fffffffffffffed8 >> 0x38,0));
      *(ggml_tensor **)(lVar1 + 0x40) = pgVar3;
    }
    break;
  case 0xb:
    if (*(long *)(lVar1 + 0x40) != 0) {
      ggml_sgn(in_stack_fffffffffffffed0,
               (ggml_tensor *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      uVar4 = (undefined1)((ulong)in_stack_fffffffffffffed8 >> 0x38);
      ggml_mul(in_stack_fffffffffffffed0,
               (ggml_tensor *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (ggml_tensor *)0x14efba);
      pgVar3 = ggml_add_impl(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                             in_stack_fffffffffffffee0,(_Bool)uVar4);
      *(ggml_tensor **)(lVar1 + 0x40) = pgVar3;
    }
    break;
  case 0xc:
    break;
  case 0xd:
    if (*(long *)(lVar1 + 0x40) != 0) {
      pgVar3 = ggml_sub_impl(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                             in_stack_fffffffffffffee0,inplace_00);
      *(ggml_tensor **)(lVar1 + 0x40) = pgVar3;
    }
    break;
  case 0xe:
    break;
  case 0xf:
    if (*(long *)(lVar1 + 0x40) != 0) {
      pgVar3 = in_RDI;
      ggml_step(in_stack_fffffffffffffed0,
                (ggml_tensor *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      uVar4 = (undefined1)((ulong)in_stack_fffffffffffffed8 >> 0x38);
      ggml_mul(in_stack_fffffffffffffed0,
               (ggml_tensor *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (ggml_tensor *)0x14f0d8);
      pgVar3 = ggml_sub_impl((ggml_context *)pgVar3,in_RDI,in_stack_fffffffffffffee0,(_Bool)uVar4);
      *(ggml_tensor **)(lVar1 + 0x40) = pgVar3;
    }
    break;
  case 0x10:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x22ad,
            "false");
    abort();
  case 0x11:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x22b1,
            "false");
    abort();
  case 0x12:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x22b5,
            "false");
    abort();
  case 0x13:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x22b9,
            "false");
    abort();
  case 0x14:
    if (*(long *)(lVar1 + 0x40) != 0) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",
              0x22bf,"false");
      abort();
    }
    if (*(long *)(lVar2 + 0x40) != 0) {
      pgVar3 = *(ggml_tensor **)(lVar2 + 0x40);
      ggml_transpose((ggml_context *)pgVar3,in_RDI);
      uVar4 = (undefined1)((ulong)in_RDI >> 0x38);
      ggml_mul_mat(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      pgVar3 = ggml_add_impl(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,pgVar3,(_Bool)uVar4
                            );
      *(ggml_tensor **)(lVar2 + 0x40) = pgVar3;
    }
    break;
  case 0x15:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x22cc,
            "false");
    abort();
  case 0x16:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x22d0,
            "false");
    abort();
  case 0x17:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x22d4,
            "false");
    abort();
  case 0x18:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x22d8,
            "false");
    abort();
  case 0x19:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x22dc,
            "false");
    abort();
  case 0x1a:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x22e0,
            "false");
    abort();
  case 0x1b:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x22e4,
            "false");
    abort();
  case 0x1c:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x22e8,
            "false");
    abort();
  case 0x1d:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x22ec,
            "false");
    abort();
  case 0x1e:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x22f0,
            "false");
    abort();
  case 0x1f:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x22f4,
            "false");
    abort();
  case 0x20:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x22f8,
            "false");
    abort();
  case 0x21:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x22fc,
            "false");
    abort();
  case 0x22:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x2300,
            "false");
    abort();
  case 0x23:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x2308,
            "false");
    abort();
  }
  return;
}

Assistant:

static void ggml_compute_backward(struct ggml_context * ctx, struct ggml_tensor * tensor, bool inplace) {
    struct ggml_tensor * src0 = tensor->src0;
    struct ggml_tensor * src1 = tensor->src1;

    switch (tensor->op) {
        case GGML_OP_DUP:
            {
                if (src0->grad) {
                    src0->grad = ggml_add_impl(ctx, src0->grad, tensor->grad, inplace);
                }
            } break;
        case GGML_OP_ADD:
            {
                if (src0->grad) {
                    src0->grad = ggml_add_impl(ctx, src0->grad, tensor->grad, inplace);
                }
                if (src1->grad) {
                    src1->grad = ggml_add_impl(ctx, src1->grad, tensor->grad, inplace);
                }
            } break;
        case GGML_OP_SUB:
            {
                if (src0->grad) {
                    src0->grad = ggml_add_impl(ctx, src0->grad, tensor->grad, inplace);
                }
                if (src1->grad) {
                    src1->grad = ggml_sub_impl(ctx, src1->grad, tensor->grad, inplace);
                }
            } break;
        case GGML_OP_MUL:
            {
                if (src0->grad) {
                    src0->grad =
                        ggml_add_impl(ctx,
                                src0->grad,
                                ggml_mul(ctx, src1, tensor->grad),
                                inplace);
                }
                if (src1->grad) {
                    src1->grad =
                        ggml_add_impl(ctx,
                                src1->grad,
                                ggml_mul(ctx, src0, tensor->grad),
                                inplace);
                }
            } break;
        case GGML_OP_DIV:
            {
                if (src0->grad) {
                    src0->grad =
                        ggml_add_impl(ctx,
                                src0->grad,
                                ggml_div(ctx, tensor->grad, src1),
                                inplace);
                }
                if (src1->grad) {
                    src1->grad =
                        ggml_sub_impl(ctx,
                                src1->grad,
                                ggml_mul(ctx,
                                    tensor->grad,
                                    ggml_div(ctx, tensor, src1)),
                                inplace);
                }
            } break;
        case GGML_OP_SQR:
            {
                if (src0->grad) {
                    src0->grad =
                        ggml_add_impl(ctx,
                                src0->grad,
                                ggml_mul(ctx,
                                    ggml_mul(ctx, src0, tensor->grad),
                                    ggml_repeat(ctx, ggml_new_f32(ctx, 2.0f), src0)),
                                inplace);
                }
            } break;
        case GGML_OP_SQRT:
            {
                if (src0->grad) {
                    src0->grad =
                        ggml_add_impl(ctx,
                                src0->grad,
                                ggml_div(ctx,
                                    ggml_repeat(ctx, ggml_new_f32(ctx, 0.5f), tensor),
                                    tensor),
                                inplace);
                }
            } break;
        case GGML_OP_SUM:
            {
                if (src0->grad) {
                    src0->grad =
                        ggml_add_impl(ctx,
                                src0->grad,
                                ggml_repeat(ctx, tensor->grad, src0->grad),
                                inplace);
                }
            } break;
        case GGML_OP_MEAN:
            {
                GGML_ASSERT(false); // TODO: implement
            } break;
        case GGML_OP_REPEAT:
            {
                if (src0->grad) {
                    src0->grad =
                        ggml_add_impl(ctx,
                                src0->grad,
                                ggml_sum(ctx, tensor->grad),
                                inplace);
                }
            } break;
        case GGML_OP_ABS:
            {
                if (src0->grad) {
                    src0->grad =
                        ggml_add_impl(ctx,
                                src0->grad,
                                ggml_mul(ctx,
                                    ggml_sgn(ctx, src0),
                                    tensor->grad),
                                inplace);
                }
            } break;
        case GGML_OP_SGN:
            {
                if (src0->grad) {
                    // noop
                }
            } break;
        case GGML_OP_NEG:
            {
                if (src0->grad) {
                    src0->grad = ggml_sub_impl(ctx, src0->grad, tensor->grad, inplace);
                }
            } break;
        case GGML_OP_STEP:
            {
                if (src0->grad) {
                    // noop
                }
            } break;
        case GGML_OP_RELU:
            {
                if (src0->grad) {
                    src0->grad = ggml_sub_impl(ctx,
                            src0->grad,
                            ggml_mul(ctx,
                                ggml_step(ctx, src0),
                                tensor->grad),
                            inplace);
                }
            } break;
        case GGML_OP_GELU:
            {
                GGML_ASSERT(false); // TODO: not implemented
            } break;
        case GGML_OP_SILU:
            {
                GGML_ASSERT(false); // TODO: not implemented
            } break;
        case GGML_OP_NORM:
            {
                GGML_ASSERT(false); // TODO: not implemented
            } break;
        case GGML_OP_RMS_NORM:
            {
                GGML_ASSERT(false); // TODO: not implemented
            } break;
        case GGML_OP_MUL_MAT:
            {
                if (src0->grad) {
                    // TODO: this requires outer product - ggml_out_prod(ctx, src1, tensor->grad);
                    GGML_ASSERT(false);
                }
                if (src1->grad) {
                    src1->grad =
                        ggml_add_impl(ctx,
                                src1->grad,
                                // TODO: fix transpose, the node will break the graph connections
                                ggml_mul_mat(ctx, ggml_transpose(ctx, src0), tensor->grad),
                                inplace);
                }
            } break;
        case GGML_OP_SCALE:
            {
                GGML_ASSERT(false); // TODO: not implemented
            } break;
        case GGML_OP_CPY:
            {
                GGML_ASSERT(false); // TODO: not implemented
            } break;
        case GGML_OP_RESHAPE:
            {
                GGML_ASSERT(false); // TODO: not implemented
            } break;
        case GGML_OP_VIEW:
            {
                GGML_ASSERT(false); // not supported
            } break;
        case GGML_OP_PERMUTE:
            {
                GGML_ASSERT(false); // TODO: not implemented
            } break;
        case GGML_OP_TRANSPOSE:
            {
                GGML_ASSERT(false); // TODO: not implemented
            } break;
        case GGML_OP_GET_ROWS:
            {
                GGML_ASSERT(false); // TODO: not implemented
            } break;
        case GGML_OP_DIAG_MASK_INF:
            {
                GGML_ASSERT(false); // TODO: not implemented
            } break;
        case GGML_OP_SOFT_MAX:
            {
                GGML_ASSERT(false); // TODO: not implemented
            } break;
        case GGML_OP_ROPE:
            {
                GGML_ASSERT(false); // TODO: not implemented
            } break;
        case GGML_OP_CONV_1D_1S:
            {
                GGML_ASSERT(false); // TODO: not implemented
            } break;
        case GGML_OP_CONV_1D_2S:
            {
                GGML_ASSERT(false); // TODO: not implemented
            } break;
        case GGML_OP_FLASH_ATTN:
            {
                GGML_ASSERT(false); // not supported
            } break;
        case GGML_OP_FLASH_FF:
            {
                GGML_ASSERT(false); // not supported
            } break;
        case GGML_OP_NONE:
            {
                // nop
            } break;
        case GGML_OP_COUNT:
            {
                GGML_ASSERT(false);
            } break;
    }
}